

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  byte bVar1;
  GCObject *pGVar2;
  global_State *pgVar3;
  uint uVar4;
  TValue *pTVar5;
  long lVar6;
  CallInfo *pCVar7;
  long lVar8;
  StkId pTVar9;
  StkId pTVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  
  iVar12 = func->tt;
  if ((long)iVar12 != 6) {
    pTVar5 = luaT_gettmbyobj(L,func,TM_CALL);
    if (pTVar5->tt != 6) {
      luaG_runerror(L,"attempt to %s a %s value","call",luaT_typenames[iVar12]);
    }
    pTVar10 = L->stack;
    for (pTVar9 = L->top; func < pTVar9; pTVar9 = pTVar9 + -1) {
      pTVar9->value = pTVar9[-1].value;
      pTVar9->tt = pTVar9[-1].tt;
    }
    if ((long)L->stack_last - (long)L->top < 0x11) {
      luaD_growstack(L,1);
    }
    L->top = L->top + 1;
    lVar13 = (long)func - (long)pTVar10;
    pTVar9 = L->stack;
    *(Value *)((long)pTVar9 + lVar13) = pTVar5->value;
    *(int *)((long)pTVar9 + lVar13 + 8) = pTVar5->tt;
    func = (StkId)(lVar13 + (long)pTVar9);
  }
  pGVar2 = (func->value).gc;
  lVar13 = (long)func - (long)L->stack;
  L->ci->savedpc = L->savedpc;
  if ((pGVar2->h).flags == '\0') {
    pgVar3 = (pGVar2->th).l_G;
    lVar6 = (long)L->stack_last - (long)L->top;
    bVar1 = *(byte *)((long)&pgVar3->GCthreshold + 3);
    lVar8 = (ulong)bVar1 * 0x10;
    if (lVar6 == lVar8 || SBORROW8(lVar6,lVar8) != (long)(lVar6 + (ulong)bVar1 * -0x10) < 0) {
      luaD_growstack(L,(uint)bVar1);
    }
    pTVar9 = (StkId)((long)L->stack + lVar13);
    if (*(char *)((long)&pgVar3->GCthreshold + 2) == '\0') {
      pTVar10 = pTVar9 + 1;
      if (pTVar9 + (ulong)*(byte *)((long)&pgVar3->GCthreshold + 1) + 1 < L->top) {
        L->top = pTVar9 + (ulong)*(byte *)((long)&pgVar3->GCthreshold + 1) + 1;
      }
    }
    else {
      pTVar10 = L->top;
      bVar1 = *(byte *)((long)&pgVar3->GCthreshold + 1);
      uVar4 = (uint)bVar1;
      iVar12 = (int)((ulong)((long)pTVar10 - (long)pTVar9) >> 4);
      if ((int)(uint)bVar1 < iVar12) {
        uVar11 = iVar12 - 1;
      }
      else {
        iVar12 = (uVar4 - iVar12) + 1;
        do {
          pTVar10->tt = 0;
          pTVar10 = pTVar10 + 1;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        L->top = pTVar10;
        uVar11 = uVar4;
      }
      pTVar10 = L->top;
      if (uVar4 != 0) {
        lVar6 = 0;
        do {
          pTVar9 = L->top;
          L->top = pTVar9 + 1;
          pTVar9->value = *(Value *)((long)&pTVar10[-(ulong)uVar11].value + lVar6);
          pTVar9->tt = *(int *)((long)&pTVar10[-(ulong)uVar11].tt + lVar6);
          *(undefined4 *)((long)&pTVar10[-(ulong)uVar11].tt + lVar6) = 0;
          lVar6 = lVar6 + 0x10;
        } while ((ulong)bVar1 << 4 != lVar6);
      }
      pTVar9 = (StkId)(lVar13 + (long)L->stack);
    }
    if (L->ci == L->end_ci) {
      pCVar7 = growCI(L);
    }
    else {
      pCVar7 = L->ci + 1;
      L->ci = pCVar7;
    }
    pCVar7->func = pTVar9;
    pCVar7->base = pTVar10;
    L->base = pTVar10;
    pTVar10 = pTVar10 + *(byte *)((long)&pgVar3->GCthreshold + 3);
    pCVar7->top = pTVar10;
    L->savedpc = (Instruction *)pgVar3->ud;
    pCVar7->tailcalls = 0;
    pCVar7->nresults = nresults;
    for (pTVar9 = L->top; pTVar9 < pTVar10; pTVar9 = pTVar9 + 1) {
      pTVar9->tt = 0;
    }
    L->top = pTVar10;
    iVar12 = 0;
  }
  else {
    if ((long)L->stack_last - (long)L->top < 0x141) {
      luaD_growstack(L,0x14);
    }
    if (L->ci == L->end_ci) {
      pCVar7 = growCI(L);
    }
    else {
      pCVar7 = L->ci + 1;
      L->ci = pCVar7;
    }
    pTVar9 = L->stack;
    pCVar7->func = (StkId)((long)pTVar9 + lVar13);
    pTVar9 = (StkId)((long)pTVar9 + lVar13 + 0x10);
    pCVar7->base = pTVar9;
    L->base = pTVar9;
    pCVar7->top = L->top + 0x14;
    pCVar7->nresults = nresults;
    uVar4 = (*(code *)(((L->ci->func->value).gc)->h).node)(L);
    if ((int)uVar4 < 0) {
      iVar12 = 2;
    }
    else {
      luaD_poscall(L,L->top + -(ulong)uVar4);
      iVar12 = 1;
    }
  }
  return iVar12;
}

Assistant:

static int luaD_precall(lua_State*L,StkId func,int nresults){
LClosure*cl;
ptrdiff_t funcr;
if(!ttisfunction(func))
func=tryfuncTM(L,func);
funcr=savestack(L,func);
cl=&clvalue(func)->l;
L->ci->savedpc=L->savedpc;
if(!cl->isC){
CallInfo*ci;
StkId st,base;
Proto*p=cl->p;
luaD_checkstack(L,p->maxstacksize);
func=restorestack(L,funcr);
if(!p->is_vararg){
base=func+1;
if(L->top>base+p->numparams)
L->top=base+p->numparams;
}
else{
int nargs=cast_int(L->top-func)-1;
base=adjust_varargs(L,p,nargs);
func=restorestack(L,funcr);
}
ci=inc_ci(L);
ci->func=func;
L->base=ci->base=base;
ci->top=L->base+p->maxstacksize;
L->savedpc=p->code;
ci->tailcalls=0;
ci->nresults=nresults;
for(st=L->top;st<ci->top;st++)
setnilvalue(st);
L->top=ci->top;
return 0;
}
else{
CallInfo*ci;
int n;
luaD_checkstack(L,20);
ci=inc_ci(L);
ci->func=restorestack(L,funcr);
L->base=ci->base=ci->func+1;
ci->top=L->top+20;
ci->nresults=nresults;
n=(*curr_func(L)->c.f)(L);
if(n<0)
return 2;
else{
luaD_poscall(L,L->top-n);
return 1;
}
}
}